

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_write_nocompress_tile
              (fitsfile *outfptr,long row,int datatype,void *tiledata,long tilelen,int nullcheck,
              void *nullflagval,int *status)

{
  fitsfile *in_RCX;
  int in_EDX;
  void *in_RDI;
  char *in_R8;
  undefined4 in_R9D;
  int *unaff_retaddr;
  int *in_stack_00000008;
  char coltype [4];
  int *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*(int *)(*(long *)((long)in_RDI + 8) + 0x4dc) < 1) {
    if (in_EDX == 0x15) {
      strcpy(&stack0xffffffffffffffc8,"1PI");
    }
    else if (in_EDX == 0x1f) {
      strcpy(&stack0xffffffffffffffc8,"1PJ");
    }
    else {
      if (in_EDX != 0x2a) {
        ffpmsg((char *)0x1e474b);
        *(undefined4 *)CONCAT44(nullcheck,coltype) = 0x19d;
        return 0x19d;
      }
      strcpy(&stack0xffffffffffffffc8,"1QE");
    }
    fficol((fitsfile *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),(int)((ulong)in_RCX >> 0x20),in_R8
           ,(char *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0);
  }
  ffgcno((fitsfile *)tiledata,tilelen._4_4_,(char *)CONCAT44(nullcheck,coltype),in_stack_00000008,
         unaff_retaddr);
  ffpcl(in_RCX,(int)((ulong)in_R8 >> 0x20),(int)in_R8,CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
        CONCAT44(nullcheck,coltype),(LONGLONG)in_RCX,in_RDI,
        (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  return *(int *)CONCAT44(nullcheck,coltype);
}

Assistant:

int imcomp_write_nocompress_tile(fitsfile *outfptr,
    long row,
    int datatype, 
    void *tiledata, 
    long tilelen,
    int nullcheck,
    void *nullflagval,
    int *status)
{
    char coltype[4];

    /* Write the uncompressed image tile pixels to the tile-compressed image file. */
    /* This is a special case when using NOCOMPRESS for diagnostic purposes in fpack. */ 
    /* Currently, this only supports a limited number of data types and */
    /* does not fully support null-valued pixels in the image. */

    if ((outfptr->Fptr)->cn_uncompressed < 1) {
        /* uncompressed data column doesn't exist, so append new column to table */
        if (datatype == TSHORT) {
	    strcpy(coltype, "1PI");
	} else if (datatype == TINT) {
	    strcpy(coltype, "1PJ");
	} else if (datatype == TFLOAT) {
	    strcpy(coltype, "1QE");
        } else {
	    ffpmsg("NOCOMPRESSION option only supported for int*2, int*4, and float*4 images");
            return(*status = DATA_COMPRESSION_ERR);
        }

        fits_insert_col(outfptr, 999, "UNCOMPRESSED_DATA", coltype, status); /* create column */
    }

    fits_get_colnum(outfptr, CASEINSEN, "UNCOMPRESSED_DATA",
                    &(outfptr->Fptr)->cn_uncompressed, status);  /* save col. num. */
    
    fits_write_col(outfptr, datatype, (outfptr->Fptr)->cn_uncompressed, row, 1,
                      tilelen, tiledata, status);  /* write the tile data */
    return (*status);
}